

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

SpectrumHandle pbrt::readSpectrumFromFile(string *filename,Allocator alloc)

{
  bool bVar1;
  iterator this;
  SpectrumHandle *this_00;
  Allocator in_RSI;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  in_RDI;
  optional<pbrt::SpectrumHandle> pls;
  string fn;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
  *in_stack_ffffffffffffff38;
  SpectrumHandle *in_stack_ffffffffffffff40;
  key_type *__k;
  optional local_70 [20];
  undefined4 local_5c;
  _Self local_58 [3];
  _Self local_40;
  string local_38 [16];
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  __k = (key_type *)local_38;
  ResolveFilename((string *)in_stack_ffffffffffffffd8);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
         ::find(in_stack_ffffffffffffff38,(key_type *)0x754137);
  local_40._M_node = this._M_node;
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator!=(&local_40,local_58);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                  *)this._M_node,__k);
    SpectrumHandle::SpectrumHandle
              (in_stack_ffffffffffffff40,(SpectrumHandle *)in_stack_ffffffffffffff38);
    local_5c = 1;
  }
  else {
    PiecewiseLinearSpectrum::Read((string *)in_stack_ffffffffffffffe0,in_RSI);
    bVar1 = pstd::optional::operator_cast_to_bool(local_70);
    if (bVar1) {
      pstd::optional<pbrt::SpectrumHandle>::operator*((optional<pbrt::SpectrumHandle> *)0x75424a);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                    *)this._M_node,__k);
      SpectrumHandle::operator=
                (in_stack_ffffffffffffff40,(SpectrumHandle *)in_stack_ffffffffffffff38);
      this_00 = pstd::optional<pbrt::SpectrumHandle>::operator*
                          ((optional<pbrt::SpectrumHandle> *)0x754287);
      SpectrumHandle::SpectrumHandle(this_00,(SpectrumHandle *)in_stack_ffffffffffffff38);
    }
    else {
      SpectrumHandle::TaggedPointer(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    local_5c = 1;
    pstd::optional<pbrt::SpectrumHandle>::~optional((optional<pbrt::SpectrumHandle> *)0x7542b1);
  }
  std::__cxx11::string::~string(local_38);
  return (SpectrumHandle)
         (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          )in_RDI.bits;
}

Assistant:

static SpectrumHandle readSpectrumFromFile(const std::string &filename, Allocator alloc) {
    std::string fn = ResolveFilename(filename);
    if (cachedSpectra.find(fn) != cachedSpectra.end())
        return cachedSpectra[fn];

    pstd::optional<SpectrumHandle> pls = PiecewiseLinearSpectrum::Read(fn, alloc);
    if (!pls)
        return nullptr;

    cachedSpectra[fn] = *pls;
    return *pls;
}